

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O1

void secp256k1_hsort(void *ptr,size_t count,size_t size,_func_int_void_ptr_void_ptr_void_ptr *cmp,
                    void *cmp_data)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  undefined8 *extraout_RDX;
  undefined8 *puVar4;
  undefined8 *__src;
  undefined8 *puVar5;
  ulong uVar6;
  void *pvVar7;
  undefined8 *__dest;
  ulong uVar8;
  uchar tmp [64];
  ulong local_a0;
  undefined8 local_78 [9];
  
  if (count < 2) {
LAB_001227d5:
    local_a0 = count;
    if (1 < count) {
      do {
        uVar3 = local_a0 - 1;
        __dest = local_78;
        memcpy(__dest,ptr,size);
        __src = (undefined8 *)(uVar3 * size + (long)ptr);
        memmove(ptr,__src,size);
        memcpy(__src,__dest,size);
        if (local_a0 != 2) {
          uVar6 = 0;
          do {
            uVar1 = uVar6 * 2 + 1;
            if (uVar3 <= uVar1) {
LAB_0012295d:
              secp256k1_hsort_cold_2();
              secp256k1_pubkey_cmp
                        ((secp256k1_context *)*extraout_RDX,(secp256k1_pubkey *)*__src,
                         (secp256k1_pubkey *)*__dest);
              return;
            }
            uVar8 = uVar6 * 2 + 2;
            if (uVar8 < uVar3) {
              __src = (undefined8 *)(uVar8 * size + (long)ptr);
              iVar2 = (*cmp)(__src,(void *)(uVar1 * size + (long)ptr),cmp_data);
              if (iVar2 < 0) goto LAB_001228d6;
              pvVar7 = (void *)(uVar6 * size + (long)ptr);
              iVar2 = (*cmp)(__src,pvVar7,cmp_data);
              if (iVar2 < 1) break;
              __dest = local_78;
              memcpy(__dest,pvVar7,size);
              memmove(pvVar7,__src,size);
              memcpy(__src,__dest,size);
              uVar6 = uVar8;
            }
            else {
LAB_001228d6:
              __src = (undefined8 *)(uVar1 * size + (long)ptr);
              pvVar7 = (void *)(uVar6 * size + (long)ptr);
              iVar2 = (*cmp)(__src,pvVar7,cmp_data);
              if (iVar2 < 1) break;
              __dest = local_78;
              memcpy(__dest,pvVar7,size);
              memmove(pvVar7,__src,size);
              memcpy(__src,__dest,size);
              uVar6 = uVar1;
            }
          } while (uVar6 < uVar3 >> 1);
        }
        local_a0 = uVar3;
      } while (1 < uVar3);
    }
    return;
  }
  uVar3 = count >> 1;
  __dest = (undefined8 *)count;
  __src = (undefined8 *)ptr;
LAB_001226b1:
  uVar3 = uVar3 - 1;
  uVar6 = uVar3;
joined_r0x001226be:
  do {
    if (count >> 1 <= uVar6) break;
    uVar1 = uVar6 * 2 + 1;
    if (count <= uVar1) {
      secp256k1_hsort_cold_1();
      goto LAB_0012295d;
    }
    uVar8 = uVar6 * 2 + 2;
    if (uVar8 < count) {
      puVar4 = (undefined8 *)(uVar8 * size + (long)ptr);
      iVar2 = (*cmp)(puVar4,(void *)(uVar1 * size + (long)ptr),cmp_data);
      if (-1 < iVar2) {
        puVar5 = (undefined8 *)(uVar6 * size + (long)ptr);
        __dest = puVar5;
        __src = puVar4;
        iVar2 = (*cmp)(puVar4,puVar5,cmp_data);
        if (iVar2 < 1) break;
        __dest = local_78;
        memcpy(__dest,puVar5,size);
        memmove(puVar5,puVar4,size);
        memcpy(puVar4,__dest,size);
        uVar6 = uVar8;
        __src = puVar4;
        goto joined_r0x001226be;
      }
    }
    puVar4 = (undefined8 *)(uVar1 * size + (long)ptr);
    puVar5 = (undefined8 *)(uVar6 * size + (long)ptr);
    __dest = puVar5;
    __src = puVar4;
    iVar2 = (*cmp)(puVar4,puVar5,cmp_data);
    if (iVar2 < 1) break;
    __dest = local_78;
    memcpy(__dest,puVar5,size);
    memmove(puVar5,puVar4,size);
    memcpy(puVar4,__dest,size);
    uVar6 = uVar1;
    __src = puVar4;
  } while( true );
  if (uVar3 == 0) goto LAB_001227d5;
  goto LAB_001226b1;
}

Assistant:

static void secp256k1_hsort(void *ptr, size_t count, size_t size,
                            int (*cmp)(const void *, const void *, void *),
                            void *cmp_data ) {
    size_t i;

    for(i = count/2; 0 < i; --i) {
        heap_down(ptr, i-1, count, size, cmp, cmp_data);
    }
    for(i = count; 1 < i; --i) {
        /* Extract the largest value from the heap */
        heap_swap(ptr, 0, i-1, size);

        /* Repair the heap condition */
        heap_down(ptr, 0, i-1, size, cmp, cmp_data);
    }
}